

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O1

void __thiscall
flatbuffers::python::PythonGenerator::GetMemberOfVectorOfStruct
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr,
          ImportMap *imports)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Parser *pPVar4;
  Type *type;
  long *plVar5;
  size_t t;
  undefined8 *puVar6;
  ulong *puVar7;
  size_type *psVar8;
  undefined8 uVar9;
  string return_type;
  ImportMapEntry import_entry;
  Type vectortype;
  string local_180;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  *local_e0;
  Type *local_d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  Type local_50;
  
  local_50.base_type = (field->value).type.element;
  local_50.struct_def = (field->value).type.struct_def;
  local_50.enum_def = (field->value).type.enum_def;
  local_50.fixed_length = (field->value).type.fixed_length;
  local_50.element = BASE_TYPE_NONE;
  local_e0 = (_Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              *)imports;
  GenReceiver(this,struct_def,code_ptr);
  (*(this->namer_).super_Namer._vptr_Namer[4])(&local_d0,&this->namer_,field);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_d0.first._M_dataplus._M_p);
  local_d8 = &(field->value).type;
  paVar2 = &local_d0.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0.first._M_dataplus._M_p,local_d0.first.field_2._M_allocated_capacity + 1
                   );
  }
  type = local_d8;
  GenPackageReference_abi_cxx11_(&local_160.first,this,local_d8);
  GenTypeGet_abi_cxx11_(&local_180,this,type);
  local_d0.first.field_2._M_allocated_capacity = local_160.first.field_2._M_allocated_capacity;
  paVar1 = &local_160.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.first._M_dataplus._M_p == paVar1) {
    local_d0.first.field_2._8_8_ = local_160.first.field_2._8_8_;
    local_d0.first._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_d0.first._M_dataplus._M_p = local_160.first._M_dataplus._M_p;
  }
  local_d0.second._M_dataplus._M_p = (pointer)&local_d0.second.field_2;
  local_160.first.field_2._M_allocated_capacity =
       local_160.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p == &local_180.field_2) {
    local_d0.second.field_2._8_8_ = local_180.field_2._8_8_;
  }
  else {
    local_d0.second._M_dataplus._M_p = local_180._M_dataplus._M_p;
  }
  local_d0.second.field_2._M_allocated_capacity = local_180.field_2._M_allocated_capacity;
  local_160.first._M_string_length = 0;
  local_160.first._M_dataplus._M_p = (pointer)paVar1;
  if ((((this->super_BaseGenerator).parser_)->opts).python_typing == true) {
    ReturnType_abi_cxx11_(&local_180,this,struct_def,field);
    std::operator+(&local_120,"(self, j: int) -> Optional[",&local_180);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_120);
    puVar7 = (ulong *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_160.first.field_2._M_allocated_capacity = *puVar7;
      local_160.first.field_2._8_8_ = plVar5[3];
      local_160.first._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_160.first.field_2._M_allocated_capacity = *puVar7;
      local_160.first._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_160.first._M_string_length = plVar5[1];
    *plVar5 = (long)puVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_160.first._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_160.first._M_dataplus._M_p,
                      local_160.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[7],_const_char_(&)[9],_true>
              (&local_160,(char (*) [7])0x387a90,(char (*) [9])"Optional");
    std::
    _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>(local_e0,&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.second._M_dataplus._M_p != &local_160.second.field_2) {
      operator_delete(local_160.second._M_dataplus._M_p,
                      local_160.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_160.first._M_dataplus._M_p,
                      local_160.first.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string,std::__cxx11::string>const&>
              (local_e0,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::append((char *)code_ptr);
  }
  OffsetPrefix_abi_cxx11_(&local_180,this,field,true);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_180,0,(char *)0x0,0x382763);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_160.first.field_2._M_allocated_capacity = *psVar8;
    local_160.first.field_2._8_8_ = plVar5[3];
    local_160.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_160.first.field_2._M_allocated_capacity = *psVar8;
    local_160.first._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_160.first._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_160.first._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_160.first._M_dataplus._M_p,
                    local_160.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_120,(anonymous_namespace)::Indent_abi_cxx11_);
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_180.field_2._M_allocated_capacity = *psVar8;
    local_180.field_2._8_8_ = plVar5[3];
  }
  else {
    local_180.field_2._M_allocated_capacity = *psVar8;
    local_180._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_180._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_180);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_160.first.field_2._M_allocated_capacity = *psVar8;
    local_160.first.field_2._8_8_ = plVar5[3];
    local_160.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_160.first.field_2._M_allocated_capacity = *psVar8;
    local_160.first._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_160.first._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_160.first._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_160.first._M_dataplus._M_p,
                    local_160.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_120.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_180,(anonymous_namespace)::Indent_abi_cxx11_);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_160.first.field_2._M_allocated_capacity = *psVar8;
    local_160.first.field_2._8_8_ = plVar5[3];
    local_160.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_160.first.field_2._M_allocated_capacity = *psVar8;
    local_160.first._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_160.first._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_160.first._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_160.first._M_dataplus._M_p,
                    local_160.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)code_ptr);
  t = InlineSize(&local_50);
  NumToString<unsigned_long>(&local_180,t);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_180);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_160.first.field_2._M_allocated_capacity = *psVar8;
    local_160.first.field_2._8_8_ = plVar5[3];
    local_160.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_160.first.field_2._M_allocated_capacity = *psVar8;
    local_160.first._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_160.first._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_160.first._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_160.first._M_dataplus._M_p,
                    local_160.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((local_50.struct_def)->fixed == false) {
    std::operator+(&local_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(anonymous_namespace)::Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(anonymous_namespace)::Indent_abi_cxx11_);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_120,(anonymous_namespace)::Indent_abi_cxx11_);
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_180.field_2._M_allocated_capacity = *psVar8;
      local_180.field_2._8_8_ = plVar5[3];
    }
    else {
      local_180.field_2._M_allocated_capacity = *psVar8;
      local_180._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_180._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_180);
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_160.first.field_2._M_allocated_capacity = *psVar8;
      local_160.first.field_2._8_8_ = plVar5[3];
      local_160.first._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_160.first.field_2._M_allocated_capacity = *psVar8;
      local_160.first._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_160.first._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_160.first._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_160.first._M_dataplus._M_p,
                      local_160.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
  }
  pPVar4 = (this->super_BaseGenerator).parser_;
  if (((pPVar4->opts).include_dependence_headers == true) && ((pPVar4->opts).python_typing == false)
     ) {
    std::operator+(&local_180,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(anonymous_namespace)::Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(anonymous_namespace)::Indent_abi_cxx11_);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_180,(anonymous_namespace)::Indent_abi_cxx11_);
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_160.first.field_2._M_allocated_capacity = *psVar8;
      local_160.first.field_2._8_8_ = plVar5[3];
      local_160.first._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_160.first.field_2._M_allocated_capacity = *psVar8;
      local_160.first._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_160.first._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_160.first._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_160.first._M_dataplus._M_p,
                      local_160.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_100,"from ",&local_d0.first);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_100);
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_120.field_2._M_allocated_capacity = *psVar8;
      local_120.field_2._8_8_ = plVar5[3];
      local_120._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_120.field_2._M_allocated_capacity = *psVar8;
      local_120._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_120._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_120,(ulong)local_d0.second._M_dataplus._M_p);
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_180.field_2._M_allocated_capacity = *psVar8;
      local_180.field_2._8_8_ = plVar5[3];
    }
    else {
      local_180.field_2._M_allocated_capacity = *psVar8;
      local_180._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_180._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_180);
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_160.first.field_2._M_allocated_capacity = *psVar8;
      local_160.first.field_2._8_8_ = plVar5[3];
      local_160.first._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_160.first.field_2._M_allocated_capacity = *psVar8;
      local_160.first._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_160.first._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_160.first._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_160.first._M_dataplus._M_p,
                      local_160.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
  }
  std::operator+(&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_70,(anonymous_namespace)::Indent_abi_cxx11_);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_100.field_2._M_allocated_capacity = *psVar8;
    local_100.field_2._8_8_ = plVar5[3];
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  }
  else {
    local_100.field_2._M_allocated_capacity = *psVar8;
    local_100._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_100._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_100);
  puVar7 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_120.field_2._M_allocated_capacity = *puVar7;
    local_120.field_2._8_8_ = plVar5[3];
    local_120._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_120.field_2._M_allocated_capacity = *puVar7;
    local_120._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_120._M_string_length = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  GenTypeGet_abi_cxx11_(&local_90,this,local_d8);
  paVar3 = &local_180.field_2;
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar2) {
    uVar9 = local_120.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_90._M_string_length + local_120._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar9 = local_90.field_2._M_allocated_capacity;
    }
    if (local_90._M_string_length + local_120._M_string_length <= (ulong)uVar9) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_90,0,(char *)0x0,(ulong)local_120._M_dataplus._M_p);
      goto LAB_002823dd;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_90._M_dataplus._M_p);
LAB_002823dd:
  psVar8 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_180.field_2._M_allocated_capacity = *psVar8;
    local_180.field_2._8_8_ = puVar6[3];
    local_180._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_180.field_2._M_allocated_capacity = *psVar8;
    local_180._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_180._M_string_length = puVar6[1];
  *puVar6 = psVar8;
  puVar6[1] = 0;
  *(undefined1 *)psVar8 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_180);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_160.first.field_2._M_allocated_capacity = *psVar8;
    local_160.first.field_2._8_8_ = plVar5[3];
    local_160.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_160.first.field_2._M_allocated_capacity = *psVar8;
    local_160.first._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_160.first._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_160.first._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_160.first._M_dataplus._M_p,
                    local_160.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar3) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_120,(anonymous_namespace)::Indent_abi_cxx11_);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_180.field_2._M_allocated_capacity = *psVar8;
    local_180.field_2._8_8_ = plVar5[3];
    local_180._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_180.field_2._M_allocated_capacity = *psVar8;
    local_180._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_180._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_180);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_160.first.field_2._M_allocated_capacity = *psVar8;
    local_160.first.field_2._8_8_ = plVar5[3];
    local_160.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_160.first.field_2._M_allocated_capacity = *psVar8;
    local_160.first._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_160.first._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_160.first._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_160.first._M_dataplus._M_p,
                    local_160.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar3) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_120,(anonymous_namespace)::Indent_abi_cxx11_);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_180.field_2._M_allocated_capacity = *psVar8;
    local_180.field_2._8_8_ = plVar5[3];
    local_180._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_180.field_2._M_allocated_capacity = *psVar8;
    local_180._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_180._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_180);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_160.first.field_2._M_allocated_capacity = *psVar8;
    local_160.first.field_2._8_8_ = plVar5[3];
    local_160.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_160.first.field_2._M_allocated_capacity = *psVar8;
    local_160.first._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_160.first._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_160.first._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_160.first._M_dataplus._M_p,
                    local_160.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar3) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_180);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_160.first.field_2._M_allocated_capacity = *psVar8;
    local_160.first.field_2._8_8_ = plVar5[3];
    local_160.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_160.first.field_2._M_allocated_capacity = *psVar8;
    local_160.first._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_160.first._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_160.first._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_160.first._M_dataplus._M_p,
                    local_160.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar3) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.second._M_dataplus._M_p != &local_d0.second.field_2) {
    operator_delete(local_d0.second._M_dataplus._M_p,
                    local_d0.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.first._M_dataplus._M_p != &local_d0.first.field_2) {
    operator_delete(local_d0.first._M_dataplus._M_p,local_d0.first.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

void GetMemberOfVectorOfStruct(const StructDef &struct_def,
                                 const FieldDef &field, std::string *code_ptr,
                                 ImportMap &imports) const {
    auto &code = *code_ptr;
    auto vectortype = field.value.type.VectorType();

    GenReceiver(struct_def, code_ptr);
    code += namer_.Method(field);
    const ImportMapEntry import_entry = {
      GenPackageReference(field.value.type), TypeName(field)
    };

    if (parser_.opts.python_typing) {
      const std::string return_type = ReturnType(struct_def, field);
      code += "(self, j: int) -> Optional[" + return_type + "]";
      imports.insert(ImportMapEntry{ "typing", "Optional" });
      imports.insert(import_entry);
    } else {
      code += "(self, j)";
    }
    code += ":" + OffsetPrefix(field);
    code += Indent + Indent + Indent + "x = self._tab.Vector(o)\n";
    code += Indent + Indent + Indent;
    code += "x += flatbuffers.number_types.UOffsetTFlags.py_type(j) * ";
    code += NumToString(InlineSize(vectortype)) + "\n";
    if (!(vectortype.struct_def->fixed)) {
      code += Indent + Indent + Indent + "x = self._tab.Indirect(x)\n";
    }
    if (parser_.opts.include_dependence_headers &&
        !parser_.opts.python_typing) {
      code += Indent + Indent + Indent;
      code += "from " + import_entry.first + " import " + import_entry.second +
              "\n";
    }
    code += Indent + Indent + Indent + "obj = " + TypeName(field) + "()\n";
    code += Indent + Indent + Indent + "obj.Init(self._tab.Bytes, x)\n";
    code += Indent + Indent + Indent + "return obj\n";
    code += Indent + Indent + "return None\n\n";
  }